

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void kratos::LatchVisitor::check_sequential(SequentialStmtBlock *stmt)

{
  pointer pEVar1;
  Port *port;
  size_type *psVar2;
  pointer pEVar3;
  size_type *psVar4;
  undefined1 local_1d0 [8];
  unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
  vars;
  unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
  ifs;
  AssignedVarVisitor a_v;
  IfVisitor visitor;
  
  pEVar3 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  visitor.ifs_._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002b5400;
  for (; pEVar3 != pEVar1; pEVar3 = pEVar3 + 1) {
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)pEVar3->var;
    if ((((Var *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)->type_ != PortIO) ||
       (*(int *)((long)&(((Var *)((long)visitor.super_IRVisitor.visited_._M_h._M_single_bucket +
                                 0x270))->super_IRNode)._vptr_IRNode + 4) != 1)) {
      visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
      visitor.super_IRVisitor._8_8_ =
           &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
      visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
      visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
      visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
      a_v.assigned_vars_._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002b5580;
      visitor.var_ = (Var *)&visitor.ifs_._M_h._M_rehash_policy._M_next_resize;
      visitor.ifs_._M_h._M_buckets = (__buckets_ptr)0x1;
      visitor.ifs_._M_h._M_bucket_count = 0;
      visitor.ifs_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      visitor.ifs_._M_h._M_element_count._0_4_ = 0x3f800000;
      visitor.ifs_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      visitor.ifs_._M_h._M_rehash_policy._4_4_ = 0;
      visitor.ifs_._M_h._M_rehash_policy._M_next_resize = 0;
      IRVisitor::visit_root((IRVisitor *)&a_v.assigned_vars_._M_h._M_single_bucket,(IRNode *)stmt);
      std::
      _Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable((_Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&vars._M_h._M_single_bucket,
                   (_Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&visitor.var_);
      psVar2 = &ifs._M_h._M_bucket_count;
      while (psVar2 = (size_type *)*psVar2, psVar2 != (size_type *)0x0) {
        a_v.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
        a_v.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
        a_v.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
        a_v.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        a_v.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
        a_v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        a_v.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
        a_v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
        ifs._M_h._M_single_bucket = visitor.ifs_._M_h._M_single_bucket;
        a_v.super_IRVisitor.visited_._M_h._M_single_bucket =
             (__node_base_ptr)&a_v.assigned_vars_._M_h._M_rehash_policy._M_next_resize;
        a_v.assigned_vars_._M_h._M_buckets = (__buckets_ptr)0x1;
        a_v.assigned_vars_._M_h._M_bucket_count = 0;
        a_v.assigned_vars_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        a_v.assigned_vars_._M_h._M_element_count._0_4_ = 0x3f800000;
        a_v.assigned_vars_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        a_v.assigned_vars_._M_h._M_rehash_policy._4_4_ = 0;
        a_v.assigned_vars_._M_h._M_rehash_policy._M_next_resize = 0;
        a_v.super_IRVisitor._8_8_ =
             &a_v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
        IRVisitor::visit_root
                  ((IRVisitor *)&ifs._M_h._M_single_bucket,
                   (IRNode *)((__node_base *)(psVar2 + 1))->_M_nxt[0x1c]._M_nxt);
        std::
        _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)local_1d0,
                     (_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)&a_v.super_IRVisitor.visited_._M_h._M_single_bucket);
        psVar4 = &vars._M_h._M_bucket_count;
        while (psVar4 = (size_type *)*psVar4, psVar4 != (size_type *)0x0) {
          check_stmt_block((StmtBlock *)((__node_base *)(psVar2 + 1))->_M_nxt[0x1e]._M_nxt,
                           (Var *)((__node_base *)(psVar4 + 1))->_M_nxt,
                           (vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)(psVar4 + 2),
                           false);
        }
        std::
        _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_1d0);
        AssignedVarVisitor::~AssignedVarVisitor((AssignedVarVisitor *)&ifs._M_h._M_single_bucket);
      }
      std::
      _Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&vars._M_h._M_single_bucket);
      IfVisitor::~IfVisitor((IfVisitor *)&a_v.assigned_vars_._M_h._M_single_bucket);
    }
  }
  return;
}

Assistant:

void static check_sequential(SequentialStmtBlock* stmt) {
        auto const& conditions = stmt->get_event_controls();
        // we care about non-clock
        for (auto const& iter : conditions) {
            auto* var = iter.var;
            if (var->type() == VarType::PortIO) {
                auto* port = reinterpret_cast<Port*>(var);
                if (port->port_type() == PortType::Clock) continue;
            }
            // check every if statement that's targeted by that variable
            IfVisitor visitor(var);
            visitor.visit_root(stmt);
            auto ifs = visitor.ifs();
            // derive the variables to check
            for (auto const& if_ : ifs) {
                AssignedVarVisitor a_v;
                a_v.visit_root(if_->then_body().get());
                auto vars = a_v.assigned_vars();
                for (auto const& [v, stmts] : vars) {
                    check_stmt_block(if_->else_body().get(), v, stmts, false);
                }
            }
        }
    }